

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

int VP8LEncodeImage(WebPConfig *config,WebPPicture *picture)

{
  int iVar1;
  int iVar2;
  WebPAuxStats *pWVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  WebPEncodingError error;
  WebPAuxStats *stats;
  int percent;
  VP8LBitWriter bw;
  size_t coded_size;
  int local_6c;
  VP8LBitWriter local_68;
  int local_38 [2];
  
  local_6c = 0;
  if (picture == (WebPPicture *)0x0) {
    return 0;
  }
  if ((config == (WebPConfig *)0x0) || (picture->argb == (uint32_t *)0x0)) {
    iVar7 = WebPEncodingSetError(picture,VP8_ENC_ERROR_NULL_PARAMETER);
    return iVar7;
  }
  iVar7 = picture->width;
  iVar1 = picture->height;
  iVar5 = VP8LBitWriterInit(&local_68,
                            (long)(iVar1 * iVar7 << (config->image_hint != WEBP_HINT_GRAPH)));
  if (iVar5 == 0) {
LAB_0014038b:
    error = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  else {
    iVar5 = WebPReportProgress(picture,1,&local_6c);
    if (iVar5 != 0) {
      pWVar3 = picture->stats;
      if (pWVar3 != (WebPAuxStats *)0x0) {
        memset(pWVar3,0,0xbc);
        pWVar3->PSNR[0] = 99.0;
        pWVar3->PSNR[1] = 99.0;
        pWVar3->PSNR[2] = 99.0;
        pWVar3->PSNR[3] = 99.0;
        pWVar3->PSNR[4] = 99.0;
      }
      iVar5 = picture->width;
      iVar2 = picture->height;
      if (0x1f < local_68.used) {
        VP8LPutBitsFlushBits(&local_68);
      }
      local_68.bits = local_68.bits | (ulong)(iVar5 - 1) << ((byte)local_68.used & 0x3f);
      iVar5 = local_68.used + 0xe;
      bVar4 = 0x11 < local_68.used;
      local_68.used = iVar5;
      if (bVar4) {
        VP8LPutBitsFlushBits(&local_68);
      }
      local_68.bits = local_68.bits | (ulong)(iVar2 - 1) << ((byte)local_68.used & 0x3f);
      local_68.used = local_68.used + 0xe;
      if (local_68.error == 0) {
        uVar6 = WebPPictureHasTransparency(picture);
        if (0x1f < local_68.used) {
          VP8LPutBitsFlushBits(&local_68);
        }
        local_68.bits = local_68.bits | (ulong)uVar6 << ((byte)local_68.used & 0x3f);
        iVar5 = local_68.used + 1;
        bVar4 = 0x1e < local_68.used;
        local_68.used = iVar5;
        if (bVar4) {
          VP8LPutBitsFlushBits(&local_68);
        }
        local_68.used = local_68.used + 3;
        if (local_68.error == 0) {
          iVar5 = WebPReportProgress(picture,2,&local_6c);
          if (iVar5 != 0) {
            iVar5 = VP8LEncodeStream(config,picture,&local_68);
            if (iVar5 == 0) goto LAB_0014047c;
            iVar5 = WebPReportProgress(picture,99,&local_6c);
            if (iVar5 != 0) {
              iVar5 = WriteImage(picture,&local_68,(size_t *)local_38);
              if (iVar5 == 0) goto LAB_0014047c;
              iVar5 = WebPReportProgress(picture,100,&local_6c);
              if (iVar5 != 0) {
                pWVar3 = picture->stats;
                if (pWVar3 != (WebPAuxStats *)0x0) {
                  pWVar3->coded_size = pWVar3->coded_size + local_38[0];
                  pWVar3->lossless_size = local_38[0];
                }
                if (picture->extra_info != (uint8_t *)0x0) {
                  memset(picture->extra_info,0,(long)((iVar1 + 0xf >> 4) * (iVar7 + 0xf >> 4)));
                }
                goto LAB_0014047c;
              }
            }
          }
          goto LAB_0014046f;
        }
      }
      goto LAB_0014038b;
    }
LAB_0014046f:
    error = VP8_ENC_ERROR_USER_ABORT;
  }
  WebPEncodingSetError(picture,error);
LAB_0014047c:
  if (local_68.error != 0) {
    WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  VP8LBitWriterWipeOut(&local_68);
  return (uint)(picture->error_code == VP8_ENC_OK);
}

Assistant:

int VP8LEncodeImage(const WebPConfig* const config,
                    const WebPPicture* const picture) {
  int width, height;
  int has_alpha;
  size_t coded_size;
  int percent = 0;
  int initial_size;
  VP8LBitWriter bw;

  if (picture == NULL) return 0;

  if (config == NULL || picture->argb == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_NULL_PARAMETER);
  }

  width = picture->width;
  height = picture->height;
  // Initialize BitWriter with size corresponding to 16 bpp to photo images and
  // 8 bpp for graphical images.
  initial_size = (config->image_hint == WEBP_HINT_GRAPH) ?
      width * height : width * height * 2;
  if (!VP8LBitWriterInit(&bw, initial_size)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  if (!WebPReportProgress(picture, 1, &percent)) {
 UserAbort:
    WebPEncodingSetError(picture, VP8_ENC_ERROR_USER_ABORT);
    goto Error;
  }
  // Reset stats (for pure lossless coding)
  if (picture->stats != NULL) {
    WebPAuxStats* const stats = picture->stats;
    memset(stats, 0, sizeof(*stats));
    stats->PSNR[0] = 99.f;
    stats->PSNR[1] = 99.f;
    stats->PSNR[2] = 99.f;
    stats->PSNR[3] = 99.f;
    stats->PSNR[4] = 99.f;
  }

  // Write image size.
  if (!WriteImageSize(picture, &bw)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  has_alpha = WebPPictureHasTransparency(picture);
  // Write the non-trivial Alpha flag and lossless version.
  if (!WriteRealAlphaAndVersion(&bw, has_alpha)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  if (!WebPReportProgress(picture, 2, &percent)) goto UserAbort;

  // Encode main image stream.
  if (!VP8LEncodeStream(config, picture, &bw)) goto Error;

  if (!WebPReportProgress(picture, 99, &percent)) goto UserAbort;

  // Finish the RIFF chunk.
  if (!WriteImage(picture, &bw, &coded_size)) goto Error;

  if (!WebPReportProgress(picture, 100, &percent)) goto UserAbort;

#if !defined(WEBP_DISABLE_STATS)
  // Save size.
  if (picture->stats != NULL) {
    picture->stats->coded_size += (int)coded_size;
    picture->stats->lossless_size = (int)coded_size;
  }
#endif

  if (picture->extra_info != NULL) {
    const int mb_w = (width + 15) >> 4;
    const int mb_h = (height + 15) >> 4;
    memset(picture->extra_info, 0, mb_w * mb_h * sizeof(*picture->extra_info));
  }

 Error:
  if (bw.error) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  VP8LBitWriterWipeOut(&bw);
  return (picture->error_code == VP8_ENC_OK);
}